

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall helics::CommonCore::getFilter(CommonCore *this,string_view name)

{
  BasicHandleInfo *this_00;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *unaff_retaddr;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *filt;
  undefined4 in_stack_fffffffffffffff8;
  InterfaceHandle in_stack_fffffffffffffffc;
  
  this_00 = (BasicHandleInfo *)
            gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
            read<helics::CommonCore::getFilter(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                      (unaff_retaddr,
                       (anon_class_8_1_898f2789 *)
                       CONCAT44(in_stack_fffffffffffffffc.hid,in_stack_fffffffffffffff8));
  if ((this_00 == (BasicHandleInfo *)0x0) || (this_00->handleType != FILTER)) {
    memset(&stack0xfffffffffffffffc,0,4);
    InterfaceHandle::InterfaceHandle((InterfaceHandle *)&stack0xfffffffffffffffc);
  }
  else {
    in_stack_fffffffffffffffc = BasicHandleInfo::getInterfaceHandle(this_00);
  }
  return (InterfaceHandle)in_stack_fffffffffffffffc.hid;
}

Assistant:

InterfaceHandle CommonCore::getFilter(std::string_view name) const
{
    const auto* filt = handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::FILTER); });
    if ((filt != nullptr) && (filt->handleType == InterfaceType::FILTER)) {
        return filt->getInterfaceHandle();
    }
    return {};
}